

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.hpp
# Opt level: O3

void __thiscall
pstore::details::descriptor<pstore::details::posix_descriptor_traits>::reset
          (descriptor<pstore::details::posix_descriptor_traits> *this,value_type r)

{
  if (-1 < this->fd_) {
    close(this->fd_);
  }
  this->fd_ = r;
  return;
}

Assistant:

void reset (value_type r = invalid) noexcept {
                if (valid ()) {
                    traits_.close (fd_);
                }
                fd_ = r;
            }